

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

uint64_t helper_float_rsqrt2_ps_mipsel(CPUMIPSState_conflict4 *env,uint64_t fdt0,uint64_t fdt2)

{
  float_status *s;
  float32 fVar1;
  float32 fVar2;
  uintptr_t unaff_retaddr;
  
  s = &(env->active_fpu).fp_status;
  fVar1 = float32_mul_mipsel((float32)fdt0,(float32)fdt2,s);
  fVar2 = float32_mul_mipsel((float32)(fdt0 >> 0x20),(float32)(fdt2 >> 0x20),s);
  fVar1 = float32_sub_mipsel(fVar1,0x3f800000,s);
  fVar2 = float32_sub_mipsel(fVar2,0x3f800000,s);
  fVar1 = float32_div_mipsel(fVar1,0x40000000,s);
  fVar2 = float32_div_mipsel(fVar2,0x40000000,s);
  update_fcr31(env,unaff_retaddr);
  return CONCAT44(fVar2,fVar1) ^ 0x8000000080000000;
}

Assistant:

uint64_t helper_float_rsqrt2_ps(CPUMIPSState *env, uint64_t fdt0, uint64_t fdt2)
{
    uint32_t fst0 = fdt0 & 0XFFFFFFFF;
    uint32_t fsth0 = fdt0 >> 32;
    uint32_t fst2 = fdt2 & 0XFFFFFFFF;
    uint32_t fsth2 = fdt2 >> 32;

    fst2 = float32_mul(fst0, fst2, &env->active_fpu.fp_status);
    fsth2 = float32_mul(fsth0, fsth2, &env->active_fpu.fp_status);
    fst2 = float32_sub(fst2, float32_one, &env->active_fpu.fp_status);
    fsth2 = float32_sub(fsth2, float32_one, &env->active_fpu.fp_status);
    fst2 = float32_chs(float32_div(fst2, FLOAT_TWO32,
                                       &env->active_fpu.fp_status));
    fsth2 = float32_chs(float32_div(fsth2, FLOAT_TWO32,
                                       &env->active_fpu.fp_status));
    update_fcr31(env, GETPC());
    return ((uint64_t)fsth2 << 32) | fst2;
}